

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::RemoveEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  IRKind IVar2;
  char cVar3;
  ushort uVar4;
  Type pSVar5;
  BasicBlock *this_00;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  LabelInstr *branchTarget;
  BasicBlock *pBVar7;
  code *pcVar8;
  NodeBase *pNVar9;
  bool bVar10;
  BasicBlock *block;
  undefined4 *puVar11;
  Type *ppFVar12;
  BranchInstr *newInstr;
  Func **ppFVar13;
  long lVar14;
  BasicBlock *this_01;
  undefined1 local_50 [8];
  Iterator iter;
  
  block = Loop::GetHeadBlock(loop);
  iter.current = (NodeBase *)block->next;
  pSVar5 = (block->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  this_00 = loop->landingPad;
  pSVar1 = &block->succList;
  if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5 == pSVar1) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar5->next->next != pSVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x241d,"(succList->HasTwo())","succList->HasTwo()");
    if (!bVar10) goto LAB_003f0705;
    *puVar11 = 0;
  }
  pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
           (pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if (pSVar6 != &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>) {
    iter.list = pSVar6;
  }
  local_50 = (undefined1  [8])pSVar1;
  ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_50);
  pNVar9 = iter.current;
  if ((*ppFVar12)->succBlock == (BasicBlock *)iter.current) {
    if (iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar10) goto LAB_003f0705;
      *puVar11 = 0;
    }
    pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar6 != local_50) {
      iter.list = pSVar6;
    }
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_50);
    this_01 = (*ppFVar12)->succBlock;
  }
  else {
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_50);
    this_01 = (*ppFVar12)->succBlock;
    if (iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar10) goto LAB_003f0705;
      *puVar11 = 0;
    }
    pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar6 != local_50) {
      iter.list = pSVar6;
    }
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_50);
    if ((*ppFVar12)->succBlock != (BasicBlock *)pNVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                          ,0x242c,"(iter.Data()->GetSucc() == tail)",
                          "iter.Data()->GetSucc() == tail");
      if (!bVar10) goto LAB_003f0705;
      *puVar11 = 0;
    }
  }
  BasicBlock::RemovePred(this_01,block,this->func->m_fg);
  BasicBlock::RemoveSucc(this_00,block,this->func->m_fg);
  if ((this_00->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x2432,"(landingPad->GetSuccList()->Count() == 0)",
                        "landingPad->GetSuccList()->Count() == 0");
    if (!bVar10) goto LAB_003f0705;
    *puVar11 = 0;
  }
  branchTarget = (LabelInstr *)this_01->firstInstr;
  IVar2 = (branchTarget->super_Instr).m_kind;
  if ((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) {
    pBVar7 = this_00->next;
    ppFVar13 = (Func **)&pBVar7->firstInstr;
    if (pBVar7 == (BasicBlock *)0x0) {
      ppFVar13 = &this_00->func;
    }
    lVar14 = 0x18;
    if (pBVar7 == (BasicBlock *)0x0) {
      lVar14 = 0xd0;
    }
    lVar14 = *(long *)((long)&(*ppFVar13)->m_alloc + lVar14);
    cVar3 = *(char *)(lVar14 + 0x39);
    if ((((cVar3 == '\x02') || (cVar3 == '\a')) ||
        (uVar4 = *(ushort *)(lVar14 + 0x30), uVar4 - 0x23 < 3)) || (uVar4 - 0x173 < 2))
    goto LAB_003f05a5;
  }
  else {
LAB_003f05a5:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x2435,
                        "(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock())"
                        ,
                        "firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock()"
                       );
    if (!bVar10) goto LAB_003f0705;
    *puVar11 = 0;
  }
  IVar2 = (branchTarget->super_Instr).m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar10) {
LAB_003f0705:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar11 = 0;
  }
  newInstr = IR::BranchInstr::New(Br,branchTarget,this->func);
  BasicBlock::InsertAfter(this_00,&newInstr->super_Instr);
  FlowGraph::AddEdge(this->func->m_fg,this_00,this_01);
  FlowGraph::RemoveBlock(this->func->m_fg,block,(GlobOpt *)0x0,false);
  if (block != (BasicBlock *)iter.current) {
    FlowGraph::RemoveBlock(this->func->m_fg,(BasicBlock *)iter.current,(GlobOpt *)0x0,false);
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoopAfterMemOp(Loop *loop)
{
    BasicBlock *head = loop->GetHeadBlock();
    BasicBlock *tail = head->next;
    BasicBlock *landingPad = loop->landingPad;
    BasicBlock *outerBlock = nullptr;
    SListBaseCounted<FlowEdge *> *succList = head->GetSuccList();
    Assert(succList->HasTwo());

    // Between the two successors of head, one is tail and the other one is the outerBlock
    SListBaseCounted<FlowEdge *>::Iterator  iter(succList);
    iter.Next();
    if (iter.Data()->GetSucc() == tail)
    {
        iter.Next();
        outerBlock = iter.Data()->GetSucc();
    }
    else
    {
        outerBlock = iter.Data()->GetSucc();
#ifdef DBG
        iter.Next();
        Assert(iter.Data()->GetSucc() == tail);
#endif
    }

    outerBlock->RemovePred(head, this->func->m_fg);
    landingPad->RemoveSucc(head, this->func->m_fg);
    Assert(landingPad->GetSuccList()->Count() == 0);

    IR::Instr* firstOuterInstr = outerBlock->GetFirstInstr();
    AssertOrFailFast(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock());
    IR::LabelInstr* label = firstOuterInstr->AsLabelInstr();
    // Add br to Outer block to keep coherence between branches and flow graph
    IR::BranchInstr *outerBr = IR::BranchInstr::New(Js::OpCode::Br, label, this->func);
    landingPad->InsertAfter(outerBr);
    this->func->m_fg->AddEdge(landingPad, outerBlock);

    this->func->m_fg->RemoveBlock(head, nullptr);

    if (head != tail)
    {
        this->func->m_fg->RemoveBlock(tail, nullptr);
    }
}